

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O1

CURLcode Curl_http2_switch(Curl_easy *data,connectdata *conn,int sockindex)

{
  undefined1 *puVar1;
  CURLcode CVar2;
  _Bool done;
  Curl_cfilter *cf;
  _Bool local_29;
  Curl_cfilter *local_28;
  
  CVar2 = http2_cfilter_add(&local_28,data,conn,sockindex);
  if (CVar2 == CURLE_OK) {
    CVar2 = cf_h2_ctx_init(local_28,data,false);
    if (CVar2 == CURLE_OK) {
      conn->httpversion = '\x14';
      puVar1 = &(conn->bits).field_0x2;
      *puVar1 = *puVar1 | 0x80;
      conn->bundle->multiuse = 2;
      Curl_multi_connchanged(data->multi);
      CVar2 = CURLE_OK;
      if (local_28->next != (Curl_cfilter *)0x0) {
        CVar2 = Curl_conn_cf_connect(local_28,data,false,&local_29);
      }
    }
  }
  return CVar2;
}

Assistant:

CURLcode Curl_http2_switch(struct Curl_easy *data,
                           struct connectdata *conn, int sockindex)
{
  struct Curl_cfilter *cf;
  CURLcode result;

  DEBUGASSERT(!Curl_conn_is_http2(data, conn, sockindex));
  DEBUGF(infof(data, "switching to HTTP/2"));

  result = http2_cfilter_add(&cf, data, conn, sockindex);
  if(result)
    return result;

  result = cf_h2_ctx_init(cf, data, FALSE);
  if(result)
    return result;

  conn->httpversion = 20; /* we know we're on HTTP/2 now */
  conn->bits.multiplex = TRUE; /* at least potentially multiplexed */
  conn->bundle->multiuse = BUNDLE_MULTIPLEX;
  Curl_multi_connchanged(data->multi);

  if(cf->next) {
    bool done;
    return Curl_conn_cf_connect(cf, data, FALSE, &done);
  }
  return CURLE_OK;
}